

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clunk.cpp
# Opt level: O0

Clunk * __thiscall clunk::Clunk::GetFEN_abi_cxx11_(Clunk *this)

{
  long in_RSI;
  Output local_20 [2];
  Clunk *this_local;
  
  this_local = this;
  if (*(long *)(in_RSI + 0x30) == 0) {
    senjo::Output::Output(local_20,InfoPrefix);
    senjo::Output::operator<<(local_20,&NOT_INITIALIZED);
    senjo::Output::~Output(local_20);
    std::__cxx11::string::string((string *)this);
  }
  else {
    Node::GetFEN_abi_cxx11_((Node *)this);
  }
  return this;
}

Assistant:

std::string Clunk::GetFEN() const {
  if (!root) {
    senjo::Output() << NOT_INITIALIZED;
    return std::string();
  }
  return root->GetFEN();
}